

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O0

bool __thiscall
Gudhi::cubical_complex::
is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
::operator()(is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
             *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  reference pvVar5;
  size_t dim2;
  size_t dim1;
  Filtration_value fil2;
  Filtration_value fil1;
  Simplex_handle *sh2_local;
  Simplex_handle *sh1_local;
  is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  *this_local;
  
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(this->CC_->
                       super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
                       super_Bitmap_cubical_complex_base<double>.data,*sh1);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(this->CC_->
                       super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
                       super_Bitmap_cubical_complex_base<double>.data,*sh2);
  dVar2 = *pvVar5;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    this_local._7_1_ = dVar1 < dVar2;
  }
  else {
    uVar3 = Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
                      ((Bitmap_cubical_complex_base<double> *)this->CC_,*sh1);
    uVar4 = Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
                      ((Bitmap_cubical_complex_base<double> *)this->CC_,*sh2);
    if (uVar3 == uVar4) {
      this_local._7_1_ = *sh1 < *sh2;
    }
    else {
      this_local._7_1_ = uVar3 < uVar4;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const typename Bitmap_cubical_complex<T>::Simplex_handle& sh1,
                  const typename Bitmap_cubical_complex<T>::Simplex_handle& sh2) const {
    // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
    typedef typename T::filtration_type Filtration_value;
    Filtration_value fil1 = CC_->data[sh1];
    Filtration_value fil2 = CC_->data[sh2];
    if (fil1 != fil2) {
      return fil1 < fil2;
    }
    // in this case they are on the same filtration level, so the dimension decide.
    std::size_t dim1 = CC_->get_dimension_of_a_cell(sh1);
    std::size_t dim2 = CC_->get_dimension_of_a_cell(sh2);
    if (dim1 != dim2) {
      return dim1 < dim2;
    }
    // in this case both filtration and dimensions of the considered cubes are the same. To have stable sort, we simply
    // compare their positions in the bitmap:
    return sh1 < sh2;
  }